

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_glyphpath_pushPrevElem
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *nextP0,FT_Vector nextP1,
               FT_Bool close)

{
  bool bVar1;
  ulong uVar2;
  FT_Pos FVar3;
  FT_Vector *pFVar4;
  int iVar5;
  int iVar6;
  FT_Long FVar7;
  long lVar8;
  int iVar9;
  CF2_F16Dot16 CVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  CF2_HintMap hintmap_00;
  ulong uVar14;
  CF2_F16Dot16 CVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  FT_Vector *pFVar19;
  bool bVar20;
  CF2_CallbackParamsRec params;
  FT_Pos local_a8;
  CF2_CallbackParamsRec_ local_78;
  
  bVar20 = glyphpath->prevElemOp != 2;
  pFVar19 = &glyphpath->prevElemP3;
  pFVar4 = &glyphpath->prevElemP2;
  if (!bVar20) {
    pFVar19 = &glyphpath->prevElemP1;
    pFVar4 = &glyphpath->prevElemP0;
  }
  uVar2 = (ulong)bVar20;
  lVar16 = (&glyphpath->prevElemP1)[uVar2 * 2].x;
  if ((lVar16 == nextP0->x) && (pFVar19->y == nextP0->y)) {
    bVar20 = true;
    local_a8 = 0;
    lVar16 = 0;
  }
  else {
    uVar14 = uVar2 * 0x20 | 0x4988;
    iVar11 = (int)(&glyphpath->prevElemP0)[uVar2 * 2].x;
    iVar12 = (int)pFVar4->y;
    iVar5 = (int)nextP0->x;
    iVar6 = (int)nextP0->y;
    lVar13 = (long)(((int)nextP1.y - iVar6) + 0x10 >> 5);
    lVar8 = (((int)lVar16 - iVar11) + 0x10 >> 5) * lVar13;
    lVar16 = (long)(((int)nextP1.x - iVar5) + 0x10 >> 5);
    lVar18 = (((int)pFVar19->y - iVar12) + 0x10 >> 5) * lVar16;
    bVar20 = true;
    iVar9 = (int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
    iVar17 = (int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10);
    if (iVar9 == iVar17) {
      local_a8 = 0;
      lVar16 = 0;
      bVar1 = true;
    }
    else {
      lVar13 = lVar13 * ((iVar5 - iVar11) + 0x10 >> 5);
      lVar16 = ((iVar6 - iVar12) + 0x10 >> 5) * lVar16;
      FVar7 = FT_DivFix((long)((int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) -
                              (int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10)),
                        (long)(iVar9 - iVar17));
      lVar16 = (&glyphpath->prevElemP0)[uVar2 * 2].x;
      lVar8 = *(long *)((long)(glyphpath->hintMap).edge + (uVar14 - 0x38));
      iVar5 = (int)lVar8;
      lVar13 = (long)(iVar5 - (int)lVar16) * (long)(int)FVar7;
      iVar11 = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10);
      local_a8 = (FT_Pos)(iVar11 + (int)lVar16);
      lVar13 = pFVar4->y;
      iVar6 = (int)pFVar19->y;
      lVar18 = (long)(iVar6 - (int)lVar13) * (long)(int)FVar7;
      iVar12 = (int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10);
      if (lVar8 == lVar16) {
        iVar9 = -iVar11;
        if (0 < iVar11) {
          iVar9 = iVar11;
        }
        if (iVar9 < glyphpath->snapThreshold) {
          local_a8 = lVar16;
        }
      }
      lVar16 = (long)(iVar12 + (int)lVar13);
      if (pFVar19->y == lVar13) {
        iVar11 = -iVar12;
        if (0 < iVar12) {
          iVar11 = iVar12;
        }
        if (iVar11 < glyphpath->snapThreshold) {
          lVar16 = lVar13;
        }
      }
      lVar8 = nextP0->x;
      if (lVar8 == nextP1.x) {
        iVar12 = (int)local_a8 - (int)lVar8;
        iVar11 = -iVar12;
        if (0 < iVar12) {
          iVar11 = iVar12;
        }
        if (iVar11 < glyphpath->snapThreshold) {
          local_a8 = lVar8;
        }
      }
      lVar13 = nextP0->y;
      if (lVar13 == nextP1.y) {
        iVar12 = (int)lVar16 - (int)lVar13;
        iVar11 = -iVar12;
        if (0 < iVar12) {
          iVar11 = iVar12;
        }
        if (iVar11 < glyphpath->snapThreshold) {
          lVar16 = lVar13;
        }
      }
      lVar18 = local_a8 - ((int)lVar8 + iVar5) / 2;
      lVar8 = lVar18 * -0x100000000 >> 0x20;
      if (-1 < lVar18) {
        lVar8 = lVar18;
      }
      if (glyphpath->miterLimit < lVar8) {
        bVar1 = true;
      }
      else {
        lVar13 = lVar16 - ((int)lVar13 + iVar6) / 2;
        lVar8 = lVar13 * -0x100000000 >> 0x20;
        if (-1 < lVar13) {
          lVar8 = lVar13;
        }
        bVar1 = glyphpath->miterLimit < lVar8;
      }
    }
    if (!bVar1) {
      *(FT_Pos *)((long)(glyphpath->hintMap).edge + (uVar14 - 0x38)) = local_a8;
      pFVar19->y = lVar16;
      bVar20 = false;
    }
  }
  pFVar4 = &glyphpath->currentDS;
  local_78.pt0.x = (glyphpath->currentDS).x;
  local_78.pt0.y = (glyphpath->currentDS).y;
  if (glyphpath->prevElemOp == 4) {
    local_78.op = 4;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&local_78.pt1,(CF2_F16Dot16)(glyphpath->prevElemP1).x,
               (CF2_F16Dot16)(glyphpath->prevElemP1).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&local_78.pt2,(CF2_F16Dot16)(glyphpath->prevElemP2).x,
               (CF2_F16Dot16)(glyphpath->prevElemP2).y);
    pFVar19 = &local_78.pt3;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,pFVar19,(CF2_F16Dot16)(glyphpath->prevElemP3).x,
               (CF2_F16Dot16)(glyphpath->prevElemP3).y);
    lVar8 = 0x18;
  }
  else {
    if (glyphpath->prevElemOp != 2) goto LAB_0023b340;
    local_78.op = 2;
    if (close == '\0') {
      CVar10 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar15 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = hintmap;
    }
    else {
      CVar10 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar15 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = &glyphpath->firstHintMap;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap_00,&local_78.pt1,CVar10,CVar15);
    pFVar19 = &local_78.pt1;
    lVar8 = 8;
    if ((local_78.pt0.x == local_78.pt1.x) && (local_78.pt0.y == local_78.pt1.y)) goto LAB_0023b340;
  }
  (**(code **)((long)&glyphpath->callbacks->moveTo + lVar8))(glyphpath->callbacks,&local_78);
  FVar3 = pFVar19->y;
  pFVar4->x = pFVar19->x;
  (glyphpath->currentDS).y = FVar3;
LAB_0023b340:
  if (!(bool)(close == '\0' & (bVar20 ^ 1U))) {
    if (close == '\0') {
      CVar10 = (CF2_F16Dot16)nextP0->x;
      CVar15 = (CF2_F16Dot16)nextP0->y;
    }
    else {
      hintmap = &glyphpath->firstHintMap;
      CVar10 = (CF2_F16Dot16)nextP0->x;
      CVar15 = (CF2_F16Dot16)nextP0->y;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap,&local_78.pt1,CVar10,CVar15);
    if ((local_78.pt1.x != pFVar4->x) || (local_78.pt1.y != (glyphpath->currentDS).y)) {
      local_78.op = 2;
      local_78.pt0.x = pFVar4->x;
      local_78.pt0.y = (glyphpath->currentDS).y;
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,&local_78);
      pFVar4->x = local_78.pt1.x;
      (glyphpath->currentDS).y = local_78.pt1.y;
    }
  }
  if (!bVar20) {
    nextP0->x = local_a8;
    nextP0->y = lVar16;
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_pushPrevElem( CF2_GlyphPath  glyphpath,
                              CF2_HintMap    hintmap,
                              FT_Vector*     nextP0,
                              FT_Vector      nextP1,
                              FT_Bool        close )
  {
    CF2_CallbackParamsRec  params;

    FT_Vector*  prevP0;
    FT_Vector*  prevP1;

    FT_Vector  intersection    = { 0, 0 };
    FT_Bool    useIntersection = FALSE;


    FT_ASSERT( glyphpath->prevElemOp == CF2_PathOpLineTo ||
               glyphpath->prevElemOp == CF2_PathOpCubeTo );

    if ( glyphpath->prevElemOp == CF2_PathOpLineTo )
    {
      prevP0 = &glyphpath->prevElemP0;
      prevP1 = &glyphpath->prevElemP1;
    }
    else
    {
      prevP0 = &glyphpath->prevElemP2;
      prevP1 = &glyphpath->prevElemP3;
    }

    /* optimization: if previous and next elements are offset by the same */
    /* amount, then there will be no gap, and no need to compute an       */
    /* intersection.                                                      */
    if ( prevP1->x != nextP0->x || prevP1->y != nextP0->y )
    {
      /* previous element does not join next element:             */
      /* adjust end point of previous element to the intersection */
      useIntersection = cf2_glyphpath_computeIntersection( glyphpath,
                                                           prevP0,
                                                           prevP1,
                                                           nextP0,
                                                           &nextP1,
                                                           &intersection );
      if ( useIntersection )
      {
        /* modify the last point of the cached element (either line or */
        /* curve)                                                      */
        *prevP1 = intersection;
      }
    }

    params.pt0 = glyphpath->currentDS;

    switch( glyphpath->prevElemOp )
    {
    case CF2_PathOpLineTo:
      params.op = CF2_PathOpLineTo;

      /* note: pt2 and pt3 are unused */

      if ( close )
      {
        /* use first hint map if closing */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }

      /* output only non-zero length lines */
      if ( params.pt0.x != params.pt1.x || params.pt0.y != params.pt1.y )
      {
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
      break;

    case CF2_PathOpCubeTo:
      params.op = CF2_PathOpCubeTo;

      /* TODO: should we intersect the interior joins (p1-p2 and p2-p3)? */
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt1,
                               glyphpath->prevElemP1.x,
                               glyphpath->prevElemP1.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt2,
                               glyphpath->prevElemP2.x,
                               glyphpath->prevElemP2.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt3,
                               glyphpath->prevElemP3.x,
                               glyphpath->prevElemP3.y );

      glyphpath->callbacks->cubeTo( glyphpath->callbacks, &params );

      glyphpath->currentDS = params.pt3;

      break;
    }

    if ( !useIntersection || close )
    {
      /* insert connecting line between end of previous element and start */
      /* of current one                                                   */
      /* note: at the end of a subpath, we might do both, so use `nextP0' */
      /* before we change it, below                                       */

      if ( close )
      {
        /* if we are closing the subpath, then nextP0 is in the first     */
        /* hint zone                                                      */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }

      if ( params.pt1.x != glyphpath->currentDS.x ||
           params.pt1.y != glyphpath->currentDS.y )
      {
        /* length is nonzero */
        params.op  = CF2_PathOpLineTo;
        params.pt0 = glyphpath->currentDS;

        /* note: pt2 and pt3 are unused */
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
    }

    if ( useIntersection )
    {
      /* return intersection point to caller */
      *nextP0 = intersection;
    }
  }